

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O3

void __thiscall
testing::internal::ParameterizedTestFactory<RenderTest_RadianceMatches_Test>::
~ParameterizedTestFactory(ParameterizedTestFactory<RenderTest_RadianceMatches_Test> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer pLVar3;
  
  (this->super_TestFactoryBase)._vptr_TestFactoryBase =
       (_func_int **)&PTR__ParameterizedTestFactory_02ee2570;
  paVar1 = &(this->parameter_).scene.description.field_2;
  pcVar2 = (this->parameter_).scene.description._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pLVar3 = (this->parameter_).scene.lights.
           super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pLVar3 != (pointer)0x0) {
    operator_delete(pLVar3,(long)(this->parameter_).scene.lights.
                                 super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pLVar3);
  }
  pcVar2 = (this->parameter_).description._M_dataplus._M_p;
  paVar1 = &(this->parameter_).description.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x80);
  return;
}

Assistant:

explicit ParameterizedTestFactory(ParamType parameter) :
      parameter_(parameter) {}